

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImageLoaderBMP.cpp
# Opt level: O1

void __thiscall
irr::video::CImageLoaderBMP::decompress8BitRLE
          (CImageLoaderBMP *this,u8 **bmpData,s32 size,s32 width,s32 height,s32 pitch)

{
  byte *pbVar1;
  byte bVar2;
  uintptr_t baseI;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  uintptr_t endI;
  byte *pbVar6;
  int iVar7;
  int iVar8;
  uintptr_t baseI_1;
  byte *__s;
  ulong __n;
  uintptr_t baseI_2;
  byte *pbVar9;
  uintptr_t endI_1;
  byte *pbVar10;
  bool bVar11;
  int local_4c;
  
  pbVar9 = *bmpData;
  iVar7 = width + pitch;
  iVar8 = height * iVar7;
  pbVar3 = (byte *)operator_new__((long)iVar8);
  if (iVar8 < 1 || size < 1) {
LAB_00201ade:
    if (*bmpData != (u8 *)0x0) {
      operator_delete__(*bmpData);
    }
    *bmpData = pbVar3;
    return;
  }
  pbVar6 = pbVar9 + size;
  pbVar10 = pbVar3 + iVar8;
  local_4c = 0;
  __s = pbVar3;
  do {
    bVar2 = *pbVar9;
    __n = (ulong)bVar2;
    pbVar1 = pbVar9 + 1;
    if (__n == 0) {
      if ((pbVar6 < pbVar1) || ((ulong)((long)pbVar6 - (long)pbVar1) < 2)) goto LAB_00201ade;
      bVar2 = *pbVar1;
      if (bVar2 == 0) {
        pbVar9 = pbVar9 + 2;
        local_4c = local_4c + 1;
        __s = pbVar3 + local_4c * iVar7;
      }
      else {
        if (bVar2 != 2) {
          if (bVar2 != 1) {
            pbVar9 = pbVar9 + 2;
            if ((ulong)bVar2 < (ulong)((long)pbVar6 - (long)pbVar9) && pbVar9 <= pbVar6) {
              bVar11 = false;
              if ((__s <= pbVar10) && ((ulong)bVar2 < (ulong)((long)pbVar10 - (long)__s))) {
                uVar4 = (uint)bVar2;
                if (bVar2 != 0) {
                  do {
                    *__s = *pbVar9;
                    pbVar9 = pbVar9 + 1;
                    __s = __s + 1;
                    uVar4 = uVar4 - 1;
                  } while (uVar4 != 0);
                }
                uVar4 = bVar2 & 1;
                uVar5 = 0;
                bVar11 = false;
                if ((ulong)uVar4 < (ulong)((long)pbVar6 - (long)pbVar9) && pbVar9 <= pbVar6) {
                  pbVar9 = pbVar9 + -1;
                  do {
                    pbVar9 = pbVar9 + 1;
                    bVar11 = uVar5 < uVar4;
                    uVar5 = 1;
                  } while (bVar11);
                  bVar11 = true;
                }
              }
            }
            else {
              bVar11 = false;
            }
            goto LAB_00201a14;
          }
          goto LAB_00201ade;
        }
        if ((pbVar6 < pbVar9 + 2) || ((ulong)((long)pbVar6 - (long)(pbVar9 + 2)) < 3))
        goto LAB_00201ade;
        __s = __s + (ulong)pbVar9[3] * (long)iVar7 + (ulong)pbVar9[2];
        pbVar9 = pbVar9 + 4;
      }
    }
    else {
      if ((ulong)((long)pbVar6 - (long)pbVar1) < 2 || pbVar6 < pbVar1) {
        bVar11 = false;
        pbVar9 = pbVar1;
      }
      else {
        pbVar9 = pbVar9 + 2;
        bVar11 = false;
        if ((__s <= pbVar10) && (__n < (ulong)((long)pbVar10 - (long)__s))) {
          memset(__s,(uint)*pbVar1,__n);
          __s = __s + (ulong)(bVar2 - 1) + 1;
          bVar11 = true;
        }
      }
LAB_00201a14:
      if (!bVar11) goto LAB_00201ade;
    }
    if ((pbVar6 <= pbVar9) || (pbVar10 <= __s)) goto LAB_00201ade;
  } while( true );
}

Assistant:

void CImageLoaderBMP::decompress8BitRLE(u8 *&bmpData, s32 size, s32 width, s32 height, s32 pitch) const
{
	u8 *p = bmpData;
	const u8 *pEnd = bmpData + size;
	u8 *newBmp = new u8[(width + pitch) * height];
	u8 *d = newBmp;
	const u8 *destEnd = newBmp + (width + pitch) * height;
	s32 line = 0;

	while (p < pEnd && d < destEnd) {
		if (*p == 0) {
			++p;
			CHECKP(1);

			switch (*p) {
			case 0: // end of line
				++p;
				++line;
				d = newBmp + (line * (width + pitch));
				break;
			case 1: // end of bmp
				goto exit;
			case 2:
				++p;
				CHECKP(2);
				d += (u8)*p;
				++p; // delta
				d += ((u8)*p) * (width + pitch);
				++p;
				break;
			default: {
				// absolute mode
				s32 count = (u8)*p;
				++p;
				s32 readAdditional = ((2 - (count % 2)) % 2);

				CHECKP(count);
				CHECKD(count);
				for (s32 i = 0; i < count; ++i) {
					*d = *p;
					++p;
					++d;
				}

				CHECKP(readAdditional);
				for (s32 i = 0; i < readAdditional; ++i)
					++p;
			}
			}
		} else {
			s32 count = (u8)*p;
			++p;
			CHECKP(1);
			u8 color = *p;
			++p;
			CHECKD(count);
			for (s32 i = 0; i < count; ++i) {
				*d = color;
				++d;
			}
		}
	}

exit:
	delete[] bmpData;
	bmpData = newBmp;
}